

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O0

void __thiscall
JetHead::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (this->mSize == this->mAllocated) {
    sizeup(this,0);
  }
  std::__cxx11::string::string((string *)(this->mData + this->mSize),(string *)val);
  this->mSize = this->mSize + 1;
  return;
}

Assistant:

void push_back(const T& val)
		{
			// If we've hit our limit, grow the array
			if (mSize == mAllocated)
			{
				sizeup();
			}
 
			// Now that we've got space, placement-new a copy of val
			new(mData + mSize) T(val);

			// And remember that we've stored another object
			mSize++;
		}